

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError getnum(long *val,char *str,int base)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  char *str_local;
  curl_off_t num;
  
  if (str == (char *)0x0) {
    return PARAM_BAD_NUMERIC;
  }
  str_local = str;
  if (base == 10) {
    bVar3 = *str == '-';
    if (bVar3) {
      str_local = str + 1;
    }
    iVar1 = Curl_str_number(&str_local,&num,0x7fffffffffffffff);
    if (iVar1 == 0) {
LAB_0011a1b6:
      iVar1 = Curl_str_single(&str_local,'\0');
      if (iVar1 != 0) {
        return PARAM_BAD_NUMERIC;
      }
      lVar2 = -num;
      if (!bVar3) {
        lVar2 = num;
      }
      *val = lVar2;
      return PARAM_OK;
    }
  }
  else {
    iVar1 = Curl_str_octal(&str_local,&num,0x7fffffffffffffff);
    if (iVar1 == 0) {
      bVar3 = false;
      goto LAB_0011a1b6;
    }
  }
  return PARAM_BAD_NUMERIC;
}

Assistant:

static ParameterError getnum(long *val, const char *str, int base)
{
  DEBUGASSERT((base == 8) || (base == 10));
  if(str) {
    curl_off_t num;
    bool is_neg = FALSE;
    if(base == 10) {
      is_neg = (*str == '-');
      if(is_neg)
        str++;
      if(curlx_str_number(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    else { /* base == 8 */
      if(curlx_str_octal(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    if(!curlx_str_single(&str, '\0')) {
      *val = (long)num;
      if(is_neg)
        *val = -*val;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}